

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  short sVar1;
  Parse *pParse_00;
  Index *pIdx;
  int in_ECX;
  int in_EDX;
  Parse *in_RSI;
  Vdbe *in_RDI;
  undefined4 in_R8D;
  int savedSelfTab;
  Parse *pParse;
  int x;
  int op;
  Column *pCol;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar2;
  Vdbe *p;
  undefined4 in_stack_ffffffffffffffe0;
  
  p = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
  if ((in_ECX < 0) || (in_ECX == (short)in_RSI->nErr)) {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  }
  else {
    if (*(u8 *)((long)&in_RSI->nMem + 3) == '\x01') {
      iVar2 = 0xb0;
    }
    else {
      p = (Vdbe *)((Column *)in_RSI->zErrMsg + in_ECX);
      if (((ulong)p->ppVPrev & 0x20000000000000) != 0) {
        pParse_00 = sqlite3VdbeParser(in_RDI);
        if (((ulong)p->ppVPrev & 0x100000000000000) != 0) {
          sqlite3ErrorMsg(pParse_00,"generated column loop on \"%s\"",p->db);
          return;
        }
        iVar2 = pParse_00->iSelfTab;
        *(u16 *)((long)&p->ppVPrev + 6) = *(u16 *)((long)&p->ppVPrev + 6) | 0x100;
        pParse_00->iSelfTab = in_EDX + 1;
        sqlite3ExprCodeGeneratedColumn
                  (in_RSI,(Table *)CONCAT44(in_EDX,in_ECX),
                   (Column *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)p >> 0x20));
        pParse_00->iSelfTab = iVar2;
        *(u16 *)((long)&p->ppVPrev + 6) = *(u16 *)((long)&p->ppVPrev + 6) & 0xfeff;
        return;
      }
      if ((in_RSI->iRangeReg & 0x80U) == 0) {
        sVar1 = sqlite3TableColumnToStorage((Table *)in_RSI,(i16)in_ECX);
      }
      else {
        pIdx = sqlite3PrimaryKeyIndex((Table *)in_RSI);
        sVar1 = sqlite3TableColumnToIndex(pIdx,(i16)in_ECX);
      }
      in_ECX = (int)sVar1;
      iVar2 = 0x5e;
    }
    sqlite3VdbeAddOp3(p,iVar2,in_ECX,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                      (int)in_stack_ffffffffffffffc8);
    sqlite3ColumnDefault((Vdbe *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(Table *)p,iVar2,in_ECX)
    ;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* Parsing context */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  Column *pCol;
  assert( v!=0 );
  assert( pTab!=0 );
  assert( iCol!=XN_EXPR );
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
    VdbeComment((v, "%s.rowid", pTab->zName));
  }else{
    int op;
    int x;
    if( IsVirtual(pTab) ){
      op = OP_VColumn;
      x = iCol;
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( (pCol = &pTab->aCol[iCol])->colFlags & COLFLAG_VIRTUAL ){
      Parse *pParse = sqlite3VdbeParser(v);
      if( pCol->colFlags & COLFLAG_BUSY ){
        sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"",
                        pCol->zCnName);
      }else{
        int savedSelfTab = pParse->iSelfTab;
        pCol->colFlags |= COLFLAG_BUSY;
        pParse->iSelfTab = iTabCur+1;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, regOut);
        pParse->iSelfTab = savedSelfTab;
        pCol->colFlags &= ~COLFLAG_BUSY;
      }
      return;
#endif
    }else if( !HasRowid(pTab) ){
      testcase( iCol!=sqlite3TableColumnToStorage(pTab, iCol) );
      x = sqlite3TableColumnToIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
      op = OP_Column;
    }else{
      x = sqlite3TableColumnToStorage(pTab,iCol);
      testcase( x!=iCol );
      op = OP_Column;
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}